

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_nal.c
# Opt level: O1

WORD32 ihevcd_nal_search_start_code(UWORD8 *pu1_buf,WORD32 bytes_remaining)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  
  uVar3 = 0;
  bVar1 = 0 < bytes_remaining;
  if (bytes_remaining < 1) {
    uVar2 = 0xffffffff;
  }
  else {
    uVar2 = bytes_remaining - 1;
    lVar5 = 0;
    do {
      uVar4 = 0;
      if ((pu1_buf[lVar5] == '\0') &&
         (uVar4 = uVar3 + 1, pu1_buf[lVar5 + 1] == '\x01' && 0 < (int)uVar3)) {
        uVar2 = (int)lVar5 + 1;
        break;
      }
      bVar1 = lVar5 < (int)uVar2;
      lVar5 = lVar5 + 1;
      uVar3 = uVar4;
    } while ((ulong)uVar2 + 1 != lVar5);
    uVar3 = (uint)(1 < (int)uVar4);
  }
  if (!bVar1) {
    uVar2 = uVar2 + (pu1_buf[(int)uVar2] == '\x01' & (byte)uVar3);
  }
  return uVar2 + 1;
}

Assistant:

WORD32 ihevcd_nal_search_start_code(UWORD8 *pu1_buf, WORD32 bytes_remaining)
{
    WORD32 ofst;

    WORD32 zero_byte_cnt;
    WORD32 start_code_found;

    ofst = -1;

    zero_byte_cnt = 0;
    start_code_found = 0;
    while(ofst < (bytes_remaining - 1))
    {
        ofst++;
        if(pu1_buf[ofst] != 0)
        {
            zero_byte_cnt = 0;
            continue;
        }

        zero_byte_cnt++;
        if((pu1_buf[ofst + 1] == START_CODE_PREFIX_BYTE) &&
           (zero_byte_cnt >= NUM_ZEROS_BEFORE_START_CODE))
        {
            /* Found the start code */
            ofst++;
            start_code_found = 1;
            break;
        }
    }
    if(0 == start_code_found)
    {
        if((START_CODE_PREFIX_BYTE == pu1_buf[ofst]) &&
           (zero_byte_cnt >= NUM_ZEROS_BEFORE_START_CODE))
        {
            /* Found a start code at the end*/
            ofst++;
        }
    }
    /* Since ofst started at -1, increment it by 1 */
    ofst++;

    return ofst;
}